

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

void __thiscall
btAxisSweep3Internal<unsigned_short>::aabbTest
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          btBroadphaseAabbCallback *callback)

{
  float *pfVar1;
  float fVar2;
  btDbvtBroadphase *pbVar3;
  Handle *pHVar4;
  ushort uVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  pbVar3 = this->m_raycastAccelerator;
  if (pbVar3 != (btDbvtBroadphase *)0x0) {
    (*(pbVar3->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[7])
              (pbVar3,aabbMin,aabbMax,callback);
    return;
  }
  uVar5 = this->m_numHandles;
  if (uVar5 != 0) {
    uVar10 = 1;
    do {
      uVar10 = uVar10 & 0xffff;
      if ((this->m_pEdges[0][uVar10].m_pos & 1) != 0) {
        pHVar4 = this->m_pHandles;
        uVar8 = (ulong)((uint)this->m_pEdges[0][uVar10].m_handle * 0x50);
        pfVar1 = (float *)((long)(pHVar4->super_btBroadphaseProxy).m_aabbMax.m_floats + uVar8);
        bVar7 = true;
        if ((aabbMin->m_floats[0] < *pfVar1 || aabbMin->m_floats[0] == *pfVar1) &&
           (fVar2 = *(float *)((long)(pHVar4->super_btBroadphaseProxy).m_aabbMin.m_floats + uVar8),
           bVar7 = true, fVar2 < aabbMax->m_floats[0] || fVar2 == aabbMax->m_floats[0])) {
          bVar7 = false;
        }
        pfVar1 = (float *)((long)(pHVar4->super_btBroadphaseProxy).m_aabbMax.m_floats + uVar8 + 8);
        bVar6 = true;
        if ((aabbMin->m_floats[2] < *pfVar1 || aabbMin->m_floats[2] == *pfVar1) &&
           (fVar2 = *(float *)((long)(pHVar4->super_btBroadphaseProxy).m_aabbMin.m_floats +
                              uVar8 + 8),
           fVar2 < aabbMax->m_floats[2] || fVar2 == aabbMax->m_floats[2])) {
          bVar6 = bVar7;
        }
        pfVar1 = (float *)((long)(pHVar4->super_btBroadphaseProxy).m_aabbMax.m_floats + uVar8 + 4);
        if (aabbMin->m_floats[1] < *pfVar1 || aabbMin->m_floats[1] == *pfVar1) {
          fVar2 = *(float *)((long)(pHVar4->super_btBroadphaseProxy).m_aabbMin.m_floats + uVar8 + 4)
          ;
          if (!bVar6 && (fVar2 < aabbMax->m_floats[1] || fVar2 == aabbMax->m_floats[1])) {
            (*callback->_vptr_btBroadphaseAabbCallback[2])(callback);
            uVar5 = this->m_numHandles;
          }
        }
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while ((uVar9 & 0xffff) <= (uint)uVar5 * 2);
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::aabbTest(const btVector3& aabbMin, const btVector3& aabbMax, btBroadphaseAabbCallback& callback)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->aabbTest(aabbMin,aabbMax,callback);
	} else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i=1;i<m_numHandles*2+1;i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				Handle* handle = getHandle(m_pEdges[axis][i].m_handle);
				if (TestAabbAgainstAabb2(aabbMin,aabbMax,handle->m_aabbMin,handle->m_aabbMax))
				{
					callback.process(handle);
				}
			}
		}
	}
}